

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  char local_99;
  string local_98;
  quaternion local_78;
  vector<3UL> local_60;
  quaternion local_48;
  
  local_78.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00106d40;
  local_78.data.super_matrix<4UL,_1UL>.data[0][0] = 1.0;
  local_78.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_78.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_78.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  local_48.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00106d40;
  local_48.data.super_matrix<4UL,_1UL>.data[0][0] = 1.0;
  local_48.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_48.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_48.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  iVar3 = 1;
  do {
    Mahony_update(&local_78);
    Madgwick_update(&local_48);
    blas::quaternion::to_euler_angles(&local_60,&local_78);
    blas::vector<3ul>::to_string_abi_cxx11_(&local_98,&local_60);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    blas::quaternion::to_euler_angles(&local_60,&local_48);
    blas::vector<3ul>::to_string_abi_cxx11_(&local_98,&local_60);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length);
    local_99 = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_99,1);
    poVar1 = std::ostream::_M_insert<double>((double)((float)iVar3 * 0.01));
    local_99 = 's';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_99,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x65);
  return 0;
}

Assistant:

int main() {
    int tick = 0;
    blas::quaternion q1 = {1, 0, 0, 0};
    blas::quaternion q2 = {1, 0, 0, 0};
    for (;;) {
        if (tick++ == 100) break;
        Mahony_update(q1);
        Madgwick_update(q2);
        std::cout << q1.to_euler_angles().to_string() << std::endl;
        std::cout << q2.to_euler_angles().to_string() << '\t' << tick * duration << 's' << std::endl << std::endl;
    }
}